

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O1

bool __thiscall
TcpSocketImpl::Connect(TcpSocketImpl *this,char *szIpToWhere,uint16_t sPort,int AddrHint)

{
  int32_t *piVar1;
  BaseSocket *pBVar2;
  undefined8 uVar3;
  int iVar4;
  TcpSocketImpl *pTVar5;
  int *piVar6;
  int *piVar7;
  bool bVar8;
  uint __val;
  uint __len;
  addrinfo *lstAddr;
  string __str;
  addrinfo hint;
  addrinfo *local_a8;
  thread local_a0;
  TcpSocketImpl *local_98;
  undefined8 local_90;
  undefined1 local_88 [40];
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  piVar1 = &(this->super_BaseSocketImpl).m_fSock;
  iVar4 = (this->super_BaseSocketImpl).m_fSock;
  if (iVar4 != -1) {
    close(iVar4);
    *piVar1 = -1;
  }
  local_a8 = (addrinfo *)0x0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_88._32_8_ = (ulong)(uint)AddrHint << 0x20;
  uStack_60 = 1;
  __val = (uint)sPort;
  __len = 1;
  if (((9 < sPort) && (__len = 2, 99 < sPort)) && (__len = 3, 999 < __val)) {
    __len = 5 - (__val < 10000);
  }
  local_98 = (TcpSocketImpl *)local_88;
  local_88._16_8_ = piVar1;
  std::__cxx11::string::_M_construct((ulong)&local_98,(char)__len);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_98,__len,__val);
  iVar4 = getaddrinfo(szIpToWhere,(char *)local_98,(addrinfo *)(local_88 + 0x20),&local_a8);
  if (local_98 != (TcpSocketImpl *)local_88) {
    operator_delete(local_98,local_88._0_8_ + 1);
  }
  uVar3 = local_88._16_8_;
  if (iVar4 == 0) {
    iVar4 = socket(local_a8->ai_family,local_a8->ai_socktype,local_a8->ai_protocol);
    *(int *)uVar3 = iVar4;
    if (iVar4 == -1) {
      piVar6 = (int *)__cxa_allocate_exception(4);
      piVar7 = __errno_location();
      *piVar6 = *piVar7;
      __cxa_throw(piVar6,&int::typeinfo,0);
    }
    (*(this->super_BaseSocketImpl)._vptr_BaseSocketImpl[0xe])(this,uVar3);
    if (local_a8->ai_family == 10) {
      local_98 = (TcpSocketImpl *)((ulong)local_98 & 0xffffffff00000000);
      iVar4 = setsockopt(*(int *)uVar3,0x29,0x1a,&local_98,4);
      if (iVar4 == -1) {
        piVar6 = (int *)__cxa_allocate_exception(4);
        piVar7 = __errno_location();
        *piVar6 = *piVar7;
        __cxa_throw(piVar6,&int::typeinfo,0);
      }
    }
    iVar4 = connect(*(int *)uVar3,local_a8->ai_addr,local_a8->ai_addrlen);
    local_88._24_8_ = this;
    if (iVar4 == -1) {
      piVar6 = __errno_location();
      iVar4 = *piVar6;
      (this->super_BaseSocketImpl).m_iError = iVar4;
      if (iVar4 != 0x73) {
        piVar6 = (int *)__cxa_allocate_exception(4);
        *piVar6 = (this->super_BaseSocketImpl).m_iError;
        __cxa_throw(piVar6,&int::typeinfo,0);
      }
      (this->super_BaseSocketImpl).m_iError = 0;
      local_98 = (TcpSocketImpl *)ConnectThread;
      local_90 = 0;
      std::thread::thread<void(TcpSocketImpl::*)(),TcpSocketImpl*,void>
                (&local_a0,(offset_in_TcpSocketImpl_to_subr *)&local_98,
                 (TcpSocketImpl **)(local_88 + 0x18));
      if ((this->m_thConnect)._M_id._M_thread != 0) goto LAB_00118a76;
      (this->m_thConnect)._M_id._M_thread = (native_handle_type)local_a0._M_id._M_thread;
    }
    else {
      GetConnectionInfo(this);
      local_98 = (TcpSocketImpl *)SelectThread;
      local_90 = 0;
      std::thread::thread<void(TcpSocketImpl::*)(),TcpSocketImpl*,void>
                (&local_a0,(offset_in_TcpSocketImpl_to_subr *)&local_98,
                 (TcpSocketImpl **)(local_88 + 0x18));
      if ((this->super_BaseSocketImpl).m_thListen._M_id._M_thread != 0) {
LAB_00118a76:
        std::terminate();
      }
      (this->super_BaseSocketImpl).m_thListen._M_id._M_thread =
           (native_handle_type)local_a0._M_id._M_thread;
      local_98 = (TcpSocketImpl *)WriteThread;
      local_90 = 0;
      local_88._24_8_ = this;
      std::thread::thread<void(TcpSocketImpl::*)(),TcpSocketImpl*,void>
                (&local_a0,(offset_in_TcpSocketImpl_to_subr *)&local_98,
                 (TcpSocketImpl **)(local_88 + 0x18));
      if ((this->super_BaseSocketImpl).m_thWrite._M_id._M_thread != 0) goto LAB_00118a76;
      (this->super_BaseSocketImpl).m_thWrite._M_id._M_thread =
           (native_handle_type)local_a0._M_id._M_thread;
      pBVar2 = (this->super_BaseSocketImpl).m_pBkRef;
      if (pBVar2 == (BaseSocket *)0x0) {
        pTVar5 = (TcpSocketImpl *)0x0;
      }
      else {
        pTVar5 = (TcpSocketImpl *)
                 __dynamic_cast(pBVar2,&BaseSocket::typeinfo,&TcpSocket::typeinfo,0);
      }
      if (pTVar5 == (TcpSocketImpl *)0x0 ||
          (this->m_fClientConnectedParam).super__Function_base._M_manager == (_Manager_type)0x0) {
        if ((this->m_fClientConnected).super__Function_base._M_manager != (_Manager_type)0x0 &&
            pTVar5 != (TcpSocketImpl *)0x0) {
          local_98 = pTVar5;
          (*(this->m_fClientConnected)._M_invoker)
                    ((_Any_data *)&this->m_fClientConnected,(TcpSocket **)&local_98);
        }
      }
      else {
        local_a0._M_id._M_thread = (id)(this->super_BaseSocketImpl).m_pvUserData;
        local_98 = pTVar5;
        (*(this->m_fClientConnectedParam)._M_invoker)
                  ((_Any_data *)&this->m_fClientConnectedParam,(TcpSocket **)&local_98,
                   (void **)&local_a0);
      }
      if ((this->m_fClientConnectedSsl).super__Function_base._M_manager != (_Manager_type)0x0) {
        local_98 = (TcpSocketImpl *)0x0;
        (*(this->m_fClientConnectedSsl)._M_invoker)
                  ((_Any_data *)&this->m_fClientConnectedSsl,&local_98);
      }
    }
    bVar8 = true;
    freeaddrinfo(local_a8);
  }
  else {
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool TcpSocketImpl::Connect(const char* const szIpToWhere, const uint16_t sPort, const int AddrHint/* = AF_UNSPEC*/)
{
    if (m_fSock != INVALID_SOCKET)
    {
        ::closesocket(m_fSock);
        m_fSock = INVALID_SOCKET;
    }

    struct addrinfo* lstAddr{}, hint{};
    hint.ai_family = AddrHint;
    hint.ai_socktype = SOCK_STREAM;

    if (::getaddrinfo(szIpToWhere, to_string(sPort).c_str(), &hint, &lstAddr) != 0)
        return false;

    bool bRet = true;

    try
    {
        m_fSock = ::socket(lstAddr->ai_family, lstAddr->ai_socktype, lstAddr->ai_protocol);
        if (m_fSock == INVALID_SOCKET)
            throw WSAGetLastError();

        SetSocketOption(m_fSock);

        if (lstAddr->ai_family == AF_INET6)
        {
            constexpr uint32_t on = 0;
            if (::setsockopt(m_fSock, IPPROTO_IPV6, IPV6_V6ONLY, reinterpret_cast<const char*>(&on), sizeof(on)) == -1)
                throw WSAGetLastError();
        }

        const int rc = ::connect(m_fSock, lstAddr->ai_addr, static_cast<int>(lstAddr->ai_addrlen));
        if (rc == SOCKET_ERROR)
        {
            m_iError = WSAGetLastError();
#if defined (_WIN32) || defined (_WIN64)
            if (m_iError != WSAEWOULDBLOCK)
#else
            if (m_iError != EINPROGRESS)
#endif
                throw m_iError;

            m_iError = 0;
            m_thConnect = thread(&TcpSocketImpl::ConnectThread, this);
        }
        else
        {
            GetConnectionInfo();

            m_thListen = thread(&TcpSocketImpl::SelectThread, this);
            m_thWrite = thread(&TcpSocketImpl::WriteThread, this);

            TcpSocket* pTcpSocket = dynamic_cast<TcpSocket*>(m_pBkRef);
            if (m_fClientConnectedParam && pTcpSocket != nullptr)
                m_fClientConnectedParam(pTcpSocket, m_pvUserData);
            else if (m_fClientConnected && pTcpSocket != nullptr)
                m_fClientConnected(pTcpSocket);

            if (m_fClientConnectedSsl)
                m_fClientConnectedSsl(nullptr);
        }
    }

    catch (const int iSocketErr)
    {
        m_iError = iSocketErr;
        m_iErrLoc = 1;

        if (m_fSock != INVALID_SOCKET)
        {
            ::closesocket(m_fSock);
            m_fSock = INVALID_SOCKET;
        }
        bRet = false;
    }

    ::freeaddrinfo(lstAddr);

    return bRet;
}